

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

matrix3d * __thiscall tinyusdz::value::matrix3d::operator=(matrix3d *this,matrix3f *src)

{
  ulong local_28;
  size_t i;
  size_t j;
  matrix3f *src_local;
  matrix3d *this_local;
  
  for (i = 0; i < 3; i = i + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      this->m[i][local_28] = (double)src->m[i][local_28];
    }
  }
  return this;
}

Assistant:

matrix3d &matrix3d::operator=(const matrix3f &src) {

  for (size_t j = 0; j < 3; j++) {
    for (size_t i = 0; i < 3; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}